

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRestruct.c
# Opt level: O0

int Abc_Abc_NodeResubCollectDivs(Abc_ManRst_t *p,Abc_Obj_t *pRoot,Cut_Cut_t *pCut)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *p_00;
  Abc_Obj_t *pAVar3;
  int local_40;
  int local_3c;
  int k;
  int i;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pNode;
  Cut_Cut_t *pCut_local;
  Abc_Obj_t *pRoot_local;
  Abc_ManRst_t *p_local;
  
  Vec_PtrClear(p->vDecs);
  Abc_NtkIncrementTravId(pRoot->pNtk);
  local_3c = 0;
  while( true ) {
    if ((int)(*(uint *)pCut >> 0x1c) <= local_3c) {
      for (local_3c = 0; iVar1 = Vec_PtrSize(p->vDecs), local_3c < iVar1; local_3c = local_3c + 1) {
        pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p->vDecs,local_3c);
        for (local_40 = 0; iVar1 = Abc_ObjFanoutNum(pAVar2), local_40 < iVar1;
            local_40 = local_40 + 1) {
          p_00 = Abc_ObjFanout(pAVar2,local_40);
          iVar1 = Abc_NodeIsTravIdCurrent(p_00);
          if ((iVar1 == 0) && (iVar1 = Abc_ObjIsPo(p_00), iVar1 == 0)) {
            pAVar3 = Abc_ObjFanin0(p_00);
            iVar1 = Abc_NodeIsTravIdCurrent(pAVar3);
            if (iVar1 != 0) {
              pAVar3 = Abc_ObjFanin1(p_00);
              iVar1 = Abc_NodeIsTravIdCurrent(pAVar3);
              if (iVar1 != 0) {
                Vec_PtrPush(p->vDecs,p_00);
                Abc_NodeSetTravIdCurrent(p_00);
              }
            }
          }
        }
      }
      return 1;
    }
    pAVar2 = Abc_NtkObj(pRoot->pNtk,*(int *)(&pCut[1].field_0x0 + (long)local_3c * 4));
    if (pAVar2 == (Abc_Obj_t *)0x0) break;
    Vec_PtrPush(p->vDecs,pAVar2);
    Abc_NodeSetTravIdCurrent(pAVar2);
    local_3c = local_3c + 1;
  }
  return 0;
}

Assistant:

int Abc_Abc_NodeResubCollectDivs( Abc_ManRst_t * p, Abc_Obj_t * pRoot, Cut_Cut_t * pCut )
{
    Abc_Obj_t * pNode, * pFanout;
    int i, k;
    // collect the leaves of the cut
    Vec_PtrClear( p->vDecs );
    Abc_NtkIncrementTravId( pRoot->pNtk );
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
    {
        pNode = Abc_NtkObj(pRoot->pNtk, pCut->pLeaves[i]);
        if ( pNode == NULL )  // the so-called "bad cut phenomenon" is due to removed nodes
            return 0;
        Vec_PtrPush( p->vDecs, pNode );
        Abc_NodeSetTravIdCurrent( pNode );        
    }
    // explore the fanouts
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vDecs, pNode, i )
    {
        // if the fanout has both fanins in the set, add it
        Abc_ObjForEachFanout( pNode, pFanout, k )
        {
            if ( Abc_NodeIsTravIdCurrent(pFanout) || Abc_ObjIsPo(pFanout) )
                continue;
            if ( Abc_NodeIsTravIdCurrent(Abc_ObjFanin0(pFanout)) && Abc_NodeIsTravIdCurrent(Abc_ObjFanin1(pFanout)) )
            {
                Vec_PtrPush( p->vDecs, pFanout );
                Abc_NodeSetTravIdCurrent( pFanout );     
            }
        }
    }
    return 1;
}